

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strict_fstream.hpp
# Opt level: O2

void strict_fstream::detail::static_method_holder::check_open
               (ios *s_p,string *filename,openmode mode)

{
  Exception *this;
  openmode mode_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (((byte)s_p[0x20] & 5) == 0) {
    return;
  }
  this = (Exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&local_d8,"strict_fstream: open(\'",&local_119);
  std::operator+(&local_b8,&local_d8,filename);
  std::operator+(&local_98,&local_b8,"\',");
  mode_to_string_abi_cxx11_(&local_f8,(static_method_holder *)(ulong)(uint)mode,mode_00);
  std::operator+(&local_78,&local_98,&local_f8);
  __lhs = &local_78;
  std::operator+(&local_58,__lhs,"): open failed: ");
  strerror_abi_cxx11_((strict_fstream *)&local_118,(int)__lhs);
  std::operator+(&local_38,&local_58,&local_118);
  Exception::Exception(this,&local_38);
  __cxa_throw(this,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

ofstream(const std::string& filename, std::ios_base::openmode mode = std::ios_base::out)
    {
        open(filename, mode);
    }